

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O1

int __thiscall EnvironmentROBARM::GetStartHeuristic(EnvironmentROBARM *this,int stateID)

{
  SBPL_Exception *this_00;
  undefined4 in_register_00000034;
  
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,stateID));
  SBPL_Exception::SBPL_Exception
            (this_00,"ERROR in EnvROBARM.. function: GetStartHeuristic undefined");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int EnvironmentROBARM::GetStartHeuristic(int stateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if (stateID >= (int)EnvROBARM.StateID2CoordTable.size()) {
        throw SBPL_Exception("ERROR in EnvROBARM... function: stateID illegal");
    }
#endif

    //define this function if it used in the planner (heuristic backward search would use it)

    throw SBPL_Exception("ERROR in EnvROBARM.. function: GetStartHeuristic undefined");

    return 0;
}